

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_c13565::MemPoolAccept::Workspace::~Workspace(Workspace *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            (&(this->m_precomputed_txdata).m_spent_outputs);
  ValidationState<TxValidationResult>::~ValidationState
            (&(this->m_state).super_ValidationState<TxValidationResult>);
  std::unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>::~unique_ptr
            (&this->m_entry);
  std::_Rb_tree<$270907ca$>::~_Rb_tree(&(this->m_ancestors)._M_t);
  std::_Rb_tree<$270907ca$>::~_Rb_tree(&(this->m_iters_conflicting)._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::
    _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
    ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                 *)this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit Workspace(const CTransactionRef& ptx) : m_ptx(ptx), m_hash(ptx->GetHash()) {}